

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O2

string * __thiscall CompileCommandParser::CommandType::at(CommandType *this,string *k)

{
  int iVar1;
  const_iterator cVar2;
  string *psVar3;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,k);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &(this->
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )._M_t._M_impl.super__Rb_tree_header) {
    psVar3 = &at(std::__cxx11::string_const&)::emptyString_abi_cxx11_;
    if (at(std::__cxx11::string_const&)::emptyString_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&at(std::__cxx11::string_const&)::emptyString_abi_cxx11_);
      if (iVar1 != 0) {
        at(std::__cxx11::string_const&)::emptyString_abi_cxx11_._M_dataplus._M_p =
             (pointer)&at(std::__cxx11::string_const&)::emptyString_abi_cxx11_.field_2;
        psVar3 = &at(std::__cxx11::string_const&)::emptyString_abi_cxx11_;
        at(std::__cxx11::string_const&)::emptyString_abi_cxx11_._M_string_length = 0;
        at(std::__cxx11::string_const&)::emptyString_abi_cxx11_.field_2._M_local_buf[0] = '\0';
        __cxa_atexit(std::__cxx11::string::~string,
                     &at(std::__cxx11::string_const&)::emptyString_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&at(std::__cxx11::string_const&)::emptyString_abi_cxx11_);
      }
    }
  }
  else {
    psVar3 = (string *)(cVar2._M_node + 2);
  }
  return (string *)(_Base_ptr)psVar3;
}

Assistant:

std::string const& at(std::string const& k) const
      {
      const_iterator i = this->find(k);
      if(i != this->end()) { return i->second; }
      static std::string emptyString;
      return emptyString;
      }